

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

double __thiscall icu_63::MoonTimeAngleFunc::eval(MoonTimeAngleFunc *this,CalendarAstronomer *a)

{
  double dVar1;
  CalendarAstronomer *a_local;
  MoonTimeAngleFunc *this_local;
  
  dVar1 = CalendarAstronomer::getMoonAge(a);
  return dVar1;
}

Assistant:

virtual double eval(CalendarAstronomer&a) { return a.getMoonAge(); }